

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::updateAncestorFlag
          (QGraphicsItemPrivate *this,GraphicsItemFlag childFlag,AncestorFlag flag,bool enabled,
          bool root)

{
  bool bVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  undefined1 in_CL;
  uint in_EDX;
  uint in_ESI;
  QGraphicsItemPrivate *in_RDI;
  undefined1 in_R8B;
  int i;
  QGraphicsItem *q;
  qsizetype in_stack_ffffffffffffffb8;
  int local_24;
  AncestorFlag in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  undefined3 uVar6;
  uint uVar7;
  GraphicsItemFlag childFlag_00;
  
  uVar7 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  childFlag_00 = CONCAT13((char)(uVar7 >> 0x18),CONCAT12(in_R8B,(short)uVar7)) & 0xff01ffff;
  pQVar2 = q_func(in_RDI);
  if ((childFlag_00 & ItemSendsScenePositionChanges) == 0) {
    if ((((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f & in_EDX) != 0) &&
       ((childFlag_00 & 0x1000000) != 0)) {
      return;
    }
    if ((((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f & in_EDX) == 0) &&
       ((childFlag_00 & 0x1000000) == 0)) {
      return;
    }
    if ((childFlag_00 & 0x1000000) == 0) {
      *(ulong *)&in_RDI->field_0x160 =
           *(ulong *)&in_RDI->field_0x160 & 0xffffffffffe0ffff |
           (ulong)((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f &
                  (in_EDX ^ 0xffffffff)) << 0x10;
    }
    else {
      *(ulong *)&in_RDI->field_0x160 =
           *(ulong *)&in_RDI->field_0x160 & 0xffffffffffe0ffff |
           ((ulong)((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f | in_EDX) &
           0x1f) << 0x10;
    }
    if ((in_ESI != 0xffffffff) &&
       (((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x20) & 0xfffff & in_ESI) == in_ESI))
    {
      return;
    }
    if ((in_ESI == 0xffffffff) && ((*(ulong *)&in_RDI->field_0x160 >> 0xd & 1) != 0)) {
      return;
    }
    if ((in_ESI == 0xfffffffe) && ((*(ulong *)&in_RDI->field_0x160 >> 0x3d & 1) != 0)) {
      return;
    }
  }
  else {
    if (in_ESI == 0xfffffffe) {
      in_EDX = 8;
      bVar1 = QGraphicsItem::filtersChildEvents((QGraphicsItem *)0x9711da);
      childFlag_00 = CONCAT13(bVar1,(int3)childFlag_00);
    }
    else if (in_ESI == 0xffffffff) {
      in_EDX = 1;
      bVar1 = QGraphicsItem::handlesChildEvents((QGraphicsItem *)0x9711f7);
      childFlag_00 = CONCAT13(bVar1,(int3)childFlag_00);
    }
    else {
      uVar6 = (undefined3)childFlag_00;
      if (in_ESI == 0x10) {
        in_EDX = 2;
        childFlag_00 = CONCAT13((*(ulong *)&in_RDI->field_0x160 & 0x1000000000) != 0,uVar6);
      }
      else if (in_ESI == 0x20) {
        in_EDX = 4;
        childFlag_00 = CONCAT13((*(ulong *)&in_RDI->field_0x160 & 0x2000000000) != 0,uVar6);
      }
      else {
        if (in_ESI != 0x80000) {
          return;
        }
        in_EDX = 0x10;
        childFlag_00 = CONCAT13((*(ulong *)&in_RDI->field_0x160 & 0x8000000000000) != 0,uVar6);
      }
    }
    if (in_RDI->parent == (QGraphicsItem *)0x0) {
      *(ulong *)&in_RDI->field_0x160 = *(ulong *)&in_RDI->field_0x160 & 0xffffffffffe0ffff;
    }
    else {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RDI->parent->d_ptr);
      if ((((((uint)((ulong)*(undefined8 *)&pQVar3->field_0x160 >> 0x10) & 0x1f & in_EDX) == 0) &&
           (pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&in_RDI->parent->d_ptr),
           ((uint)((ulong)*(undefined8 *)&pQVar3->field_0x160 >> 0x20) & 0xfffff & in_ESI) != in_ESI
           )) && ((in_ESI != 0xffffffff ||
                  (pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                            ::operator->(&in_RDI->parent->d_ptr),
                  (*(ulong *)&pQVar3->field_0x160 >> 0xd & 1) == 0)))) &&
         ((in_ESI != 0xfffffffe ||
          (pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->(&in_RDI->parent->d_ptr),
          (*(ulong *)&pQVar3->field_0x160 >> 0x3d & 1) == 0)))) {
        *(ulong *)&in_RDI->field_0x160 =
             *(ulong *)&in_RDI->field_0x160 & 0xffffffffffe0ffff |
             (ulong)((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f &
                    (in_EDX ^ 0xffffffff)) << 0x10;
      }
      else {
        childFlag_00 = CONCAT13(1,(int3)childFlag_00);
        *(ulong *)&in_RDI->field_0x160 =
             *(ulong *)&in_RDI->field_0x160 & 0xffffffffffe0ffff |
             ((ulong)((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x10) & 0x1f | in_EDX) &
             0x1f) << 0x10;
      }
    }
  }
  local_24 = 0;
  while( true ) {
    this_00 = (QList<QGraphicsItem_*> *)(long)local_24;
    qVar4 = QList<QGraphicsItem_*>::size(&in_RDI->children);
    if (qVar4 <= (long)this_00) break;
    ppQVar5 = QList<QGraphicsItem_*>::at(this_00,in_stack_ffffffffffffffb8);
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&(*ppQVar5)->d_ptr);
    updateAncestorFlag((QGraphicsItemPrivate *)CONCAT44(in_ESI,in_EDX),childFlag_00,
                       in_stack_ffffffffffffffe8,SUB81((ulong)pQVar2 >> 0x38,0),
                       SUB81((ulong)pQVar2 >> 0x30,0));
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateAncestorFlag(QGraphicsItem::GraphicsItemFlag childFlag,
                                           AncestorFlag flag, bool enabled, bool root)
{
    Q_Q(QGraphicsItem);
    if (root) {
        // For root items only. This is the item that has either enabled or
        // disabled \a childFlag, or has been reparented.
        switch (int(childFlag)) {
        case -2:
            flag = AncestorFiltersChildEvents;
            enabled = q->filtersChildEvents();
            break;
        case -1:
            flag = AncestorHandlesChildEvents;
            enabled = q->handlesChildEvents();
            break;
        case QGraphicsItem::ItemClipsChildrenToShape:
            flag = AncestorClipsChildren;
            enabled = flags & QGraphicsItem::ItemClipsChildrenToShape;
            break;
        case QGraphicsItem::ItemIgnoresTransformations:
            flag = AncestorIgnoresTransformations;
            enabled = flags & QGraphicsItem::ItemIgnoresTransformations;
            break;
        case QGraphicsItem::ItemContainsChildrenInShape:
            flag = AncestorContainsChildren;
            enabled = flags & QGraphicsItem::ItemContainsChildrenInShape;
            break;
        default:
            return;
        }

        if (parent) {
            // Inherit the enabled-state from our parents.
            if ((parent->d_ptr->ancestorFlags & flag)
                    || (int(parent->d_ptr->flags & childFlag) == childFlag)
                    || (int(childFlag) == -1 && parent->d_ptr->handlesChildEvents)
                    || (int(childFlag) == -2 && parent->d_ptr->filtersDescendantEvents)) {
                enabled = true;
                ancestorFlags |= flag;
            } else {
                ancestorFlags &= ~flag;
            }
        } else {
            // Top-level root items don't have any ancestors, so there are no
            // ancestor flags either.
            ancestorFlags = 0;
        }
    } else {
        // Don't set or propagate the ancestor flag if it's already correct.
        if (((ancestorFlags & flag) && enabled) || (!(ancestorFlags & flag) && !enabled))
            return;

        // Set the flag.
        if (enabled)
            ancestorFlags |= flag;
        else
            ancestorFlags &= ~flag;

        // Don't process children if the item has the main flag set on itself.
        if ((int(childFlag) != -1 &&  int(flags & childFlag) == childFlag)
            || (int(childFlag) == -1 && handlesChildEvents)
            || (int(childFlag) == -2 && filtersDescendantEvents))
            return;
    }

    for (int i = 0; i < children.size(); ++i)
        children.at(i)->d_ptr->updateAncestorFlag(childFlag, flag, enabled, false);
}